

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlineedit.cpp
# Opt level: O2

void QLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  InputMethodQuery property;
  CursorMoveStyle *pCVar1;
  undefined1 *puVar2;
  PrivateShared *pPVar3;
  undefined1 *puVar4;
  bool bVar5;
  byte bVar6;
  CursorMoveStyle CVar7;
  undefined4 uVar8;
  undefined4 in_register_00000014;
  QString *placeholderText;
  long in_FS_OFFSET;
  QVariant in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (IndexOfMethod < _c) goto switchD_003ef2c3_caseD_3;
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        textChanged((QLineEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        textEdited((QLineEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cursorPositionChanged((QLineEdit *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        returnPressed((QLineEdit *)_o);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        editingFinished((QLineEdit *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        selectionChanged((QLineEdit *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        inputRejected((QLineEdit *)_o);
        return;
      }
      break;
    case 7:
      placeholderText = (QString *)_a[1];
switchD_003ef326_caseD_1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setText((QLineEdit *)_o,placeholderText);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        clear((QLineEdit *)_o);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        selectAll((QLineEdit *)_o);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        undo((QLineEdit *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        redo((QLineEdit *)_o);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cut((QLineEdit *)_o);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        copy((QLineEdit *)_o,
             (EVP_PKEY_CTX *)
             ((long)&switchD_003ef2c3::switchdataD_0065ca70 +
             (long)(int)(&switchD_003ef2c3::switchdataD_0065ca70)[_c]),
             (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        paste((QLineEdit *)_o);
        return;
      }
      break;
    case 0xf:
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      property = *_a[1];
      ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
      inputMethodQuery((QVariant *)&local_58,(QLineEdit *)_o,property,in_stack_ffffffffffffff88);
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    default:
      goto switchD_003ef2c3_caseD_3;
    }
    goto LAB_003efa3d;
  case ReadProperty:
    if (0x12 < (uint)_id) goto switchD_003ef2c3_caseD_3;
    break;
  case WriteProperty:
    if (0x12 < (uint)_id) goto switchD_003ef2c3_caseD_3;
    placeholderText = (QString *)*_a;
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setInputMask((QLineEdit *)_o,placeholderText);
        return;
      }
      break;
    case 1:
      goto switchD_003ef326_caseD_1;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setMaxLength((QLineEdit *)_o,*(int *)&(placeholderText->d).d);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFrame((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setEchoMode((QLineEdit *)_o,*(EchoMode *)&(placeholderText->d).d);
        return;
      }
      break;
    default:
      goto switchD_003ef2c3_caseD_3;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setCursorPosition((QLineEdit *)_o,*(int *)&(placeholderText->d).d);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setAlignment((QLineEdit *)_o,
                     (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                     *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&(placeholderText->d).d);
        return;
      }
      break;
    case 8:
      if (*(char *)&(placeholderText->d).d == '\0') {
        uVar8 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
      }
      else {
        uVar8 = 0xffffffff;
      }
      *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) = uVar8;
      goto switchD_003ef2c3_caseD_3;
    case 0xb:
      *(byte *)(*(long *)(_o + 8) + 0x27c) =
           *(byte *)(*(long *)(_o + 8) + 0x27c) & 0xf7 | *(char *)&(placeholderText->d).d << 3;
      goto switchD_003ef2c3_caseD_3;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setReadOnly((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0x10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setPlaceholderText((QLineEdit *)_o,placeholderText);
        return;
      }
      break;
    case 0x11:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setCursorMoveStyle((QLineEdit *)_o,*(CursorMoveStyle *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0x12:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setClearButtonEnabled((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
    }
    goto LAB_003efa3d;
  default:
    goto switchD_003ef2c3_caseD_3;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)textChanged,0,0);
    if ((((!bVar5) &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(QString_const&)>
                            ((QtMocHelpers *)_a,(void **)textEdited,0,1), !bVar5)) &&
        (bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)(int,int)>
                           ((QtMocHelpers *)_a,(void **)cursorPositionChanged,0,2), !bVar5)) &&
       (((bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>
                            ((QtMocHelpers *)_a,(void **)returnPressed,0,3), !bVar5 &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>
                            ((QtMocHelpers *)_a,(void **)editingFinished,0,4), !bVar5)) &&
        (bVar5 = QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>
                           ((QtMocHelpers *)_a,(void **)selectionChanged,0,5), !bVar5)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtMocHelpers::indexOfMethod<void(QLineEdit::*)()>
                  ((QtMocHelpers *)_a,(void **)inputRejected,0,6);
        return;
      }
      goto LAB_003efa3d;
    }
    goto switchD_003ef2c3_caseD_3;
  }
  pCVar1 = (CursorMoveStyle *)*_a;
  switch(_id) {
  case 0:
    inputMask((QString *)&local_58,(QLineEdit *)_o);
    goto LAB_003ef9ca;
  case 1:
    text((QString *)&local_58,(QLineEdit *)_o);
    goto LAB_003ef9ca;
  case 2:
    CVar7 = *(CursorMoveStyle *)(*(long *)(*(long *)(_o + 8) + 600) + 0x60);
    goto LAB_003ef9a8;
  case 3:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x27c);
    goto LAB_003ef952;
  case 4:
    CVar7 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 4 & 3;
    goto LAB_003ef9a8;
  case 5:
    displayText((QString *)&local_58,(QLineEdit *)_o);
    goto LAB_003ef9ca;
  case 6:
    CVar7 = *(CursorMoveStyle *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
    goto LAB_003ef9a8;
  case 7:
    CVar7 = *(CursorMoveStyle *)(*(long *)(_o + 8) + 0x288);
    goto LAB_003ef9a8;
  case 8:
    *(bool *)pCVar1 =
         *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) !=
         *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
    goto switchD_003ef2c3_caseD_3;
  case 9:
    bVar5 = hasSelectedText((QLineEdit *)_o);
    break;
  case 10:
    selectedText((QString *)&local_58,(QLineEdit *)_o);
    goto LAB_003ef9ca;
  case 0xb:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x27c) >> 3;
    goto LAB_003ef952;
  case 0xc:
    bVar6 = *(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 2;
LAB_003ef952:
    bVar5 = (bool)(bVar6 & 1);
    break;
  case 0xd:
    bVar5 = isUndoAvailable((QLineEdit *)_o);
    break;
  case 0xe:
    bVar5 = isRedoAvailable((QLineEdit *)_o);
    break;
  case 0xf:
    bVar5 = hasAcceptableInput((QLineEdit *)_o);
    break;
  case 0x10:
    QLineEdit::placeholderText((QString *)&local_58,(QLineEdit *)_o);
LAB_003ef9ca:
    pPVar3 = *(PrivateShared **)pCVar1;
    puVar4 = *(undefined1 **)(pCVar1 + 2);
    *(PrivateShared **)pCVar1 = local_58.shared;
    *(undefined8 *)(pCVar1 + 2) = local_58._8_8_;
    puVar2 = *(undefined1 **)(pCVar1 + 4);
    *(undefined8 *)(pCVar1 + 4) = local_58._16_8_;
    local_58.shared = pPVar3;
    local_58._8_8_ = puVar4;
    local_58._16_8_ = puVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    goto switchD_003ef2c3_caseD_3;
  case 0x11:
    CVar7 = cursorMoveStyle((QLineEdit *)_o);
LAB_003ef9a8:
    *pCVar1 = CVar7;
    goto switchD_003ef2c3_caseD_3;
  case 0x12:
    bVar5 = isClearButtonEnabled((QLineEdit *)_o);
  }
  *(bool *)pCVar1 = bVar5;
switchD_003ef2c3_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003efa3d:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLineEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textEdited((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->returnPressed(); break;
        case 4: _t->editingFinished(); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->inputRejected(); break;
        case 7: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->clear(); break;
        case 9: _t->selectAll(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->cut(); break;
        case 13: _t->copy(); break;
        case 14: _t->paste(); break;
        case 15: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textEdited, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(int , int )>(_a, &QLineEdit::cursorPositionChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::returnPressed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::editingFinished, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::inputRejected, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->inputMask(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maxLength(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 4: *reinterpret_cast<EchoMode*>(_v) = _t->echoMode(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->displayText(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->cursorPosition(); break;
        case 7: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->isUndoAvailable(); break;
        case 14: *reinterpret_cast<bool*>(_v) = _t->isRedoAvailable(); break;
        case 15: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 17: *reinterpret_cast<Qt::CursorMoveStyle*>(_v) = _t->cursorMoveStyle(); break;
        case 18: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInputMask(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setMaxLength(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setEchoMode(*reinterpret_cast<EchoMode*>(_v)); break;
        case 6: _t->setCursorPosition(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 8: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 17: _t->setCursorMoveStyle(*reinterpret_cast<Qt::CursorMoveStyle*>(_v)); break;
        case 18: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}